

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O0

void ma_abi_map_acc_twist_to_wrench(ma_abi *m,ga_acc_twist *xdd,ma_wrench *f)

{
  ma_wrench *f_local;
  ga_acc_twist *xdd_local;
  ma_abi *m_local;
  
  if (m == (ma_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x23d,
                  "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
                 );
  }
  if (xdd == (ga_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x23e,
                  "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
                 );
  }
  if (f == (ma_wrench *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x23f,
                  "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
                 );
  }
  if (xdd->frame == (frame *)0x0) {
    __assert_fail("xdd->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x240,
                  "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
                 );
  }
  if (xdd->point != xdd->frame->origin) {
    __assert_fail("xdd->point == xdd->frame->origin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x241,
                  "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
                 );
  }
  if (xdd->point != m->point) {
    __assert_fail("xdd->point == m->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x242,
                  "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
                 );
  }
  if (xdd->target_body != m->body) {
    __assert_fail("xdd->target_body == m->body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x243,
                  "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
                 );
  }
  if (xdd->frame == m->frame) {
    f->body = xdd->target_body;
    f->point = xdd->point;
    f->frame = xdd->frame;
    return;
  }
  __assert_fail("xdd->frame == m->frame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x244,
                "void ma_abi_map_acc_twist_to_wrench(const struct ma_abi *, const struct ga_acc_twist *, struct ma_wrench *)"
               );
}

Assistant:

void ma_abi_map_acc_twist_to_wrench(
        const struct ma_abi *m,
        const struct ga_acc_twist *xdd,
        struct ma_wrench *f)
{
    assert(m);
    assert(xdd);
    assert(f);
    assert(xdd->frame);
    assert(xdd->point == xdd->frame->origin);       // screw twist
    assert(xdd->point == m->point);
    assert(xdd->target_body == m->body);
    assert(xdd->frame == m->frame);

    f->body = xdd->target_body;
    f->point = xdd->point;
    f->frame = xdd->frame;
}